

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

RenderableTextureT * __thiscall nite::Texture::draw(Texture *this,float x,float y,float angle)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  RenderableTextureT *this_00;
  Color *pCVar4;
  long lVar5;
  float fVar6;
  Vec2 local_48;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  lVar5 = (long)this->objectId;
  if (lVar5 < 0) {
    return (RenderableTextureT *)0x0;
  }
  local_30 = (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5].Width;
  fVar1 = (this->region).w;
  if ((fVar1 != local_30) || (NAN(fVar1) || NAN(local_30))) {
    fVar6 = (this->region).h;
  }
  else {
    local_2c = (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5].Height;
    fVar6 = (this->region).h;
    if ((fVar6 == local_2c) && (!NAN(fVar6) && !NAN(local_2c))) goto LAB_001a2681;
  }
  local_2c = fVar6;
  local_30 = fVar1;
LAB_001a2681:
  local_3c = angle;
  local_38 = y;
  local_34 = x;
  bVar3 = isClippingOut(x,y,local_30,local_2c,0.0,0.0);
  if ((bVar3) && (bVar3 = isItOnBatch(), !bVar3)) {
    return (RenderableTextureT *)0x0;
  }
  this_00 = (RenderableTextureT *)operator_new(0x88);
  RenderableTextureT::RenderableTextureT(this_00);
  (this_00->size).x = local_30;
  (this_00->size).y = local_2c;
  (this_00->super_Renderable).position.x = local_34;
  (this_00->super_Renderable).position.y = local_38;
  this_00->objectId = this->objectId;
  this_00->angle = local_3c;
  this_00->smooth = this->smooth;
  Vec2::Vec2(&local_48,0.0,0.0);
  this_00->origin = local_48;
  (this_00->super_Renderable).function = drawTexture;
  pCVar4 = getColor();
  fVar1 = pCVar4->g;
  fVar6 = pCVar4->b;
  fVar2 = pCVar4->a;
  (this_00->super_Renderable).color.r = pCVar4->r;
  (this_00->super_Renderable).color.g = fVar1;
  (this_00->super_Renderable).color.b = fVar6;
  (this_00->super_Renderable).color.a = fVar2;
  fVar1 = (this->region).y;
  fVar6 = (this->region).w;
  fVar2 = (this->region).h;
  (this_00->region).x = (this->region).x;
  (this_00->region).y = fVar1;
  (this_00->region).w = fVar6;
  (this_00->region).h = fVar2;
  this_00->scale = this->scale;
  addRenderList((Renderable *)this_00);
  return this_00;
}

Assistant:

nite::RenderableTextureT * nite::Texture::draw(float x, float y, float angle){
	if(objectId <= -1) return NULL;
	float rw = textureList[objectId].Width;
	float rh = textureList[objectId].Height;
	if(region.w != textureList[objectId].Width || region.h !=textureList[objectId].Height){
		rw = region.w;
		rh = region.h;
	}
	if(isClippingOut(x, y, rw, rh, 0.0f, 0.0f) && !isItOnBatch()) return NULL;
	nite::RenderableTextureT *obj = new nite::RenderableTextureT();
	obj->size.x			= rw;
	obj->size.y 		= rh;
	obj->position.x 	= x;
	obj->position.y 	= y;
	obj->objectId			= objectId;
	obj->angle 			= angle;
	obj->smooth 		= smooth;
	obj->origin			= nite::Vec2(0, 0);
	obj->function		= &drawTexture;
	obj->color			= nite::getColor();
	obj->region			= region;
	obj->scale			= scale;
	nite::addRenderList((nite::Renderable*)obj);
	return obj;
}